

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tls_connection.cc
# Opt level: O0

void __thiscall AliTlsConnection::AliTlsConnection(AliTlsConnection *this,string *host,int port)

{
  int port_local;
  string *host_local;
  AliTlsConnection *this_local;
  
  AliConnection::AliConnection(&this->super_AliConnection);
  (this->super_AliConnection)._vptr_AliConnection = (_func_int **)&PTR_Connect_001ebec0;
  std::__cxx11::string::string((string *)&this->host_);
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = port;
  return;
}

Assistant:

AliTlsConnection::AliTlsConnection(std::string host, int port) {
  this->host_ = host;
  this->port_ = port;
}